

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_text_clamp(nk_user_font *font,char *text,int text_len,float space,int *glyphs,
                 float *text_width,nk_rune *sep_list,int sep_count)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float local_6c;
  float local_68;
  int local_64;
  int local_5c;
  nk_rune unicode;
  float local_54;
  float local_50;
  float local_4c;
  char *local_48;
  int *local_40;
  float *local_38;
  
  unicode = 0;
  local_54 = space;
  local_48 = text;
  local_40 = glyphs;
  local_38 = text_width;
  iVar1 = nk_utf_decode(text,&unicode,text_len);
  iVar4 = 0;
  local_6c = 0.0;
  iVar3 = 0;
  local_5c = 0;
  local_64 = 0;
  local_68 = 0.0;
  local_4c = 0.0;
  do {
    if (((iVar1 == 0) || (local_54 <= local_4c)) || (text_len <= iVar4)) {
      if (local_5c == 0) {
        local_5c = iVar4;
      }
      if (text_len <= iVar4) {
        local_5c = iVar4;
        local_68 = local_6c;
        local_64 = iVar3;
      }
      *local_40 = local_64;
      *local_38 = local_68;
      return local_5c;
    }
    iVar4 = iVar4 + iVar1;
    local_50 = (*font->width)(font->userdata,font->height,local_48,iVar4);
    iVar1 = 0;
    do {
      iVar2 = iVar1;
      if (sep_count <= iVar2) goto LAB_0011edd3;
      iVar1 = 1;
    } while (unicode != *sep_list);
    local_64 = iVar3 + 1;
    local_68 = local_4c;
    local_6c = local_4c;
    local_5c = iVar4;
LAB_0011edd3:
    iVar3 = iVar3 + 1;
    if (iVar2 == sep_count) {
      local_68 = local_4c;
      local_6c = local_4c;
      local_64 = iVar3;
    }
    iVar1 = nk_utf_decode(local_48 + iVar4,&unicode,text_len - iVar4);
    local_4c = local_50;
  } while( true );
}

Assistant:

NK_INTERN int
nk_text_clamp(const struct nk_user_font *font, const char *text,
    int text_len, float space, int *glyphs, float *text_width,
    nk_rune *sep_list, int sep_count)
{
    int i = 0;
    int glyph_len = 0;
    float last_width = 0;
    nk_rune unicode = 0;
    float width = 0;
    int len = 0;
    int g = 0;
    float s;

    int sep_len = 0;
    int sep_g = 0;
    float sep_width = 0;
    sep_count = NK_MAX(sep_count,0);

    glyph_len = nk_utf_decode(text, &unicode, text_len);
    while (glyph_len && (width < space) && (len < text_len)) {
        len += glyph_len;
        s = font->width(font->userdata, font->height, text, len);
        for (i = 0; i < sep_count; ++i) {
            if (unicode != sep_list[i]) continue;
            sep_width = last_width = width;
            sep_g = g+1;
            sep_len = len;
            break;
        }
        if (i == sep_count){
            last_width = sep_width = width;
            sep_g = g+1;
        }
        width = s;
        glyph_len = nk_utf_decode(&text[len], &unicode, text_len - len);
        g++;
    }
    if (len >= text_len) {
        *glyphs = g;
        *text_width = last_width;
        return len;
    } else {
        *glyphs = sep_g;
        *text_width = sep_width;
        return (!sep_len) ? len: sep_len;
    }
}